

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,SubroutineSymbol *symbol)

{
  bool bVar1;
  SubroutineSymbol *local_18;
  
  bVar1 = handleDefault<slang::ast::SubroutineSymbol>(this,symbol);
  if ((bVar1) && (((symbol->flags).m_bits & 0x80) != 0)) {
    local_18 = symbol;
    SmallVectorBase<slang::ast::SubroutineSymbol_const*>::
    emplace_back<slang::ast::SubroutineSymbol_const*>
              ((SmallVectorBase<slang::ast::SubroutineSymbol_const*> *)&this->dpiImports,&local_18);
  }
  return;
}

Assistant:

void handle(const SubroutineSymbol& symbol) {
        if (!handleDefault(symbol))
            return;

        if (symbol.flags.has(MethodFlags::DPIImport))
            dpiImports.push_back(&symbol);
    }